

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2ModDel::set(V2ModDel *this,syVModDel *para)

{
  uint32_t uVar1;
  float fVar2;
  float fVar3;
  float lenscale;
  syVModDel *para_local;
  V2ModDel *this_local;
  
  this->wetout = (para->amount - 64.0) * 0.015625;
  this->dryout = 1.0 - ABS(this->wetout);
  this->fbval = (para->fb - 64.0) * 0.015625;
  fVar2 = ((float)this->dbufmask - 1023.0) / 128.0;
  this->dboffs[0] = (int)(para->llength * fVar2);
  this->dboffs[1] = (int)(para->rlength * fVar2);
  fVar2 = this->inst->SRfclinfreq;
  fVar3 = calcfreq(para->mrate / 128.0);
  this->mfreq = (int)(fVar2 * 1973915.5 * fVar3);
  this->mmaxoffs = (int)((para->mdepth * 1023.0) / 128.0);
  uVar1 = ftou32((para->mphase - 64.0) / 128.0);
  this->mphase = uVar1;
  return;
}

Assistant:

void set(const syVModDel *para)
    {
        wetout = (para->amount - 64.0f) / 64.0f;
        dryout = 1.0f - fabsf(wetout);
        fbval = (para->fb - 64.0f) / 64.0f;

        float lenscale = ((float)dbufmask - 1023.0f) / 128.0f;
        dboffs[0] = (int)(para->llength * lenscale);
        dboffs[1] = (int)(para->rlength * lenscale);

        mfreq = (int)(inst->SRfclinfreq * fcmdlfomul * calcfreq(para->mrate / 128.0f));
        mmaxoffs = (int)(para->mdepth * 1023.0f / 128.0f);
        mphase = ftou32((para->mphase - 64.0f) / 128.0f);
    }